

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ply_reader.h
# Opt level: O2

void __thiscall draco::PlyElement::~PlyElement(PlyElement *this)

{
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
  ::~_Rb_tree(&(this->property_index_)._M_t);
  std::vector<draco::PlyProperty,_std::allocator<draco::PlyProperty>_>::~vector(&this->properties_);
  std::__cxx11::string::~string((string *)this);
  return;
}

Assistant:

void AddProperty(const PlyProperty &prop) {
    property_index_[prop.name()] = static_cast<int>(properties_.size());
    properties_.emplace_back(prop);
    if (!properties_.back().is_list()) {
      properties_.back().ReserveData(static_cast<int>(num_entries_));
    }
  }